

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O2

Point3f __thiscall
pbrt::AnimatedTransform::operator()(AnimatedTransform *this,Point3f *p,Float time)

{
  Tuple3<pbrt::Point3,_float> TVar1;
  Transform t;
  Transform local_90;
  
  if ((this->actuallyAnimated == true) && (this->startTime < time)) {
    if (time < this->endTime) {
      Interpolate(&local_90,this,time);
      TVar1 = (Tuple3<pbrt::Point3,_float>)Transform::operator()(&local_90,p);
      return (Point3f)TVar1;
    }
    this = (AnimatedTransform *)&this->endTransform;
  }
  TVar1 = (Tuple3<pbrt::Point3,_float>)Transform::operator()(&this->startTransform,p);
  return (Point3f)TVar1;
}

Assistant:

Point3f AnimatedTransform::operator()(const Point3f &p, Float time) const {
    if (!actuallyAnimated || time <= startTime)
        return startTransform(p);
    else if (time >= endTime)
        return endTransform(p);
    Transform t = Interpolate(time);
    return t(p);
}